

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O2

int LoadManifests(bool measure_command_evaluation)

{
  bool bVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  allocator<char> local_1d1;
  RealDiskInterface disk_interface;
  string local_1c8;
  string err;
  State state;
  ManifestParser parser;
  
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  disk_interface = (RealDiskInterface)&PTR__FileReader_00129c68;
  State::State(&state);
  ManifestParser::ManifestParser
            (&parser,&state,(FileReader *)&disk_interface,(ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"build.ninja",&local_1d1);
  bVar1 = Parser::Load(&parser.super_Parser,&local_1c8,&err,(Lexer *)0x0);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (bVar1) {
    iVar2 = 0;
    if (measure_command_evaluation) {
      iVar2 = 0;
      for (uVar3 = 0;
          uVar3 < (ulong)((long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
        Edge::EvaluateCommand_abi_cxx11_
                  (&local_1c8,
                   state.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3],false);
        iVar2 = iVar2 + (int)local_1c8._M_string_length;
        std::__cxx11::string::~string((string *)&local_1c8);
      }
    }
    State::~State(&state);
    std::__cxx11::string::~string((string *)&err);
    return iVar2;
  }
  fprintf(_stderr,"Failed to read test data: %s\n",err._M_dataplus._M_p);
  exit(1);
}

Assistant:

int LoadManifests(bool measure_command_evaluation) {
  string err;
  RealDiskInterface disk_interface;
  State state;
  ManifestParser parser(&state, &disk_interface);
  if (!parser.Load("build.ninja", &err)) {
    fprintf(stderr, "Failed to read test data: %s\n", err.c_str());
    exit(1);
  }
  // Doing an empty build involves reading the manifest and evaluating all
  // commands required for the requested targets. So include command
  // evaluation in the perftest by default.
  int optimization_guard = 0;
  if (measure_command_evaluation)
    for (size_t i = 0; i < state.edges_.size(); ++i)
      optimization_guard += state.edges_[i]->EvaluateCommand().size();
  return optimization_guard;
}